

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageFlipVertical(Image *image)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  void *__dest;
  long lVar5;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    iVar2 = GetPixelDataSize(1,1,image->format);
    iVar2 = iVar2 * image->width;
    iVar1 = image->height;
    pvVar3 = malloc((long)(iVar2 * iVar1));
    iVar4 = (iVar1 + -1) * iVar2;
    __dest = pvVar3;
    for (lVar5 = (long)iVar1; 0 < lVar5; lVar5 = lVar5 + -1) {
      memcpy(__dest,(void *)((long)image->data + (long)iVar4),(long)iVar2);
      __dest = (void *)((long)__dest + (long)iVar2);
      iVar4 = iVar4 - iVar2;
    }
    free(image->data);
    image->data = pvVar3;
  }
  return;
}

Assistant:

void ImageFlipVertical(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *flippedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int i = (image->height - 1), offsetSize = 0; i >= 0; i--)
        {
            memcpy(flippedData + offsetSize, ((unsigned char *)image->data) + i*image->width*bytesPerPixel, image->width*bytesPerPixel);
            offsetSize += image->width*bytesPerPixel;
        }

        RL_FREE(image->data);
        image->data = flippedData;
    }
}